

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetConstant(SQFuncState *this,SQObject *cons)

{
  bool bVar1;
  SQObject *in_RSI;
  long in_RDI;
  SQObjectPtr val;
  SQChar *in_stack_ffffffffffffff88;
  SQFuncState *in_stack_ffffffffffffff90;
  SQObjectPtr *val_00;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQTable *in_stack_ffffffffffffffc8;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  SQObject *local_10;
  
  local_10 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_20);
  val_00 = *(SQObjectPtr **)(in_RDI + 0xf8);
  ::SQObjectPtr::SQObjectPtr(&local_30,local_10);
  bVar1 = SQTable::Get(in_stack_ffffffffffffffb8.pTable,in_stack_ffffffffffffffb0,val_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 = *(SQFuncState **)(in_RDI + 0xf8);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0,local_10);
    SQTable::NewSlot(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (SQObjectPtr *)in_stack_ffffffffffffffb8.pTable);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
    *(long *)(in_RDI + 0x130) = *(long *)(in_RDI + 0x130) + 1;
    if (0x7fffffff < *(long *)(in_RDI + 0x130)) {
      ::SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffff90);
      Error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  return (SQInteger)local_20.super_SQObject._unVal.pTable;
}

Assistant:

SQInteger SQFuncState::GetConstant(const SQObject &cons)
{
    SQObjectPtr val;
    if(!_table(_literals)->Get(cons,val))
    {
        val = _nliterals;
        _table(_literals)->NewSlot(cons,val);
        _nliterals++;
        if(_nliterals > MAX_LITERALS) {
            val.Null();
            Error(_SC("internal compiler error: too many literals"));
        }
    }
    return _integer(val);
}